

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

float ImGui::TableGetHeaderRowHeight(void)

{
  float fVar1;
  ImVec2 IVar2;
  uint uVar3;
  char *text;
  ImGuiStyle *pIVar4;
  int column_n;
  int iVar5;
  float local_28;
  
  local_28 = GetTextLineHeight();
  iVar5 = 0;
  if (GImGui->CurrentTable != (ImGuiTable *)0x0) {
    iVar5 = GImGui->CurrentTable->ColumnsCount;
  }
  column_n = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
    column_n = 0;
  }
  for (; iVar5 != column_n; column_n = column_n + 1) {
    uVar3 = TableGetColumnFlags(column_n);
    if ((uVar3 & 0x1001000) == 0x1000000) {
      text = TableGetColumnName(column_n);
      IVar2 = CalcTextSize(text,(char *)0x0,false,-1.0);
      uVar3 = -(uint)(IVar2.y <= local_28);
      local_28 = (float)(uVar3 & (uint)local_28 | ~uVar3 & (uint)IVar2.y);
    }
  }
  pIVar4 = GetStyle();
  fVar1 = (pIVar4->CellPadding).y;
  return fVar1 + fVar1 + local_28;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    float row_height = GetTextLineHeight();
    int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        ImGuiTableColumnFlags flags = TableGetColumnFlags(column_n);
        if ((flags & ImGuiTableColumnFlags_IsEnabled) && !(flags & ImGuiTableColumnFlags_NoHeaderLabel))
            row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(column_n)).y);
    }
    row_height += GetStyle().CellPadding.y * 2.0f;
    return row_height;
}